

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageFieldNoLabel
          (Parser *this,FieldDescriptorProto *field,
          RepeatedPtrField<google::protobuf::DescriptorProto> *messages,
          LocationRecorder *parent_location,int location_field_number_for_nested_type,
          LocationRecorder *field_location,FileDescriptorProto *containing_file)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  string *psVar4;
  DescriptorProto *this_00;
  LocationRecorder *this_01;
  allocator<char> local_f9;
  LocationRecorder location_1;
  Type type;
  LocationRecorder location;
  Token name_token;
  MapField map_field;
  
  map_field.key_type_name._M_dataplus._M_p = (pointer)&map_field.key_type_name.field_2;
  map_field.is_map_field = false;
  map_field.key_type_name._M_string_length = 0;
  map_field.key_type_name.field_2._M_local_buf[0] = '\0';
  map_field.value_type_name._M_dataplus._M_p = (pointer)&map_field.value_type_name.field_2;
  map_field.value_type_name._M_string_length = 0;
  map_field.value_type_name.field_2._M_local_buf[0] = '\0';
  LocationRecorder::LocationRecorder(&location,field_location);
  LocationRecorder::RecordLegacyLocation(&location,&field->super_Message,TYPE);
  type = FieldDescriptorProto_Type_TYPE_INT32;
  name_token._0_8_ = &name_token.text._M_string_length;
  name_token.text._M_dataplus._M_p = (pointer)0x0;
  name_token.text._M_string_length._0_1_ = 0;
  bVar2 = TryConsume(this,"map");
  if (bVar2) {
    bVar2 = LookingAt(this,"<");
    if (bVar2) {
      map_field.is_map_field = true;
      goto LAB_002d764e;
    }
    bVar2 = true;
    std::__cxx11::string::assign((char *)&name_token);
  }
  else {
LAB_002d764e:
    bVar2 = false;
  }
  uVar1 = (field->_has_bits_).has_bits_[0];
  if (map_field.is_map_field == true) {
    if ((char)uVar1 < '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&location_1,"Map fields are not allowed in oneofs.",&local_f9);
      AddError(this,(string *)&location_1);
    }
    else if ((uVar1 >> 8 & 1) == 0) {
      if ((uVar1 & 2) == 0) {
        FieldDescriptorProto::set_label(field,FieldDescriptorProto_Label_LABEL_REPEATED);
        bVar2 = Consume(this,"<");
        if ((((bVar2) &&
             (bVar2 = ParseType(this,&map_field.key_type,&map_field.key_type_name), bVar2)) &&
            (bVar2 = Consume(this,","), bVar2)) &&
           ((bVar2 = ParseType(this,&map_field.value_type,&map_field.value_type_name), bVar2 &&
            (bVar2 = Consume(this,">"), bVar2)))) {
          SourceCodeInfo_Location::add_path(location.location_,6);
          goto LAB_002d7810;
        }
        goto LAB_002d7af7;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&location_1,"Map fields are not allowed to be extensions.",&local_f9);
      AddError(this,(string *)&location_1);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&location_1,
                 "Field labels (required/optional/repeated) are not allowed on map fields.",
                 &local_f9);
      AddError(this,(string *)&location_1);
    }
    std::__cxx11::string::~string((string *)&location_1);
  }
  else {
    if (((uVar1 >> 8 & 1) == 0) && (bVar3 = DefaultToOptionalFields(this), bVar3)) {
      FieldDescriptorProto::set_label(field,FieldDescriptorProto_Label_LABEL_OPTIONAL);
    }
    if (((field->_has_bits_).has_bits_[0] & 0x100) == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&location_1,"Expected \"required\", \"optional\", or \"repeated\".",
                 &local_f9);
      AddError(this,(string *)&location_1);
      std::__cxx11::string::~string((string *)&location_1);
      FieldDescriptorProto::set_label(field,FieldDescriptorProto_Label_LABEL_OPTIONAL);
    }
    if ((bVar2) || (bVar2 = ParseType(this,&type,(string *)&name_token), bVar2)) {
      if (name_token.text._M_dataplus._M_p == (pointer)0x0) {
        SourceCodeInfo_Location::add_path(location.location_,5);
        FieldDescriptorProto::set_type(field,type);
      }
      else {
        SourceCodeInfo_Location::add_path(location.location_,6);
        FieldDescriptorProto::set_type_name(field,(string *)&name_token);
      }
LAB_002d7810:
      std::__cxx11::string::~string((string *)&name_token);
      LocationRecorder::~LocationRecorder(&location);
      io::Tokenizer::Token::Token(&name_token,&this->input_->current_);
      LocationRecorder::LocationRecorder(&location_1,field_location,1);
      LocationRecorder::RecordLegacyLocation(&location_1,&field->super_Message,NAME);
      psVar4 = FieldDescriptorProto::mutable_name_abi_cxx11_(field);
      bVar2 = ConsumeIdentifier(this,psVar4,"Expected field name.");
      LocationRecorder::~LocationRecorder(&location_1);
      if ((bVar2) && (bVar2 = Consume(this,"=","Missing field number."), bVar2)) {
        LocationRecorder::LocationRecorder(&location_1,field_location,3);
        LocationRecorder::RecordLegacyLocation(&location_1,&field->super_Message,NUMBER);
        bVar2 = ConsumeInteger(this,(int *)&location,"Expected field number.");
        if (!bVar2) {
          this_01 = &location_1;
LAB_002d7b14:
          LocationRecorder::~LocationRecorder(this_01);
          goto LAB_002d7b19;
        }
        (field->_has_bits_).has_bits_[0] = (field->_has_bits_).has_bits_[0] | 0x40;
        field->number_ = (int32)location.parser_;
        LocationRecorder::~LocationRecorder(&location_1);
        bVar2 = ParseFieldOptions(this,field,field_location,containing_file);
        if (!bVar2) goto LAB_002d7b19;
        if ((((field->_has_bits_).has_bits_[0] & 0x200) == 0) || (field->type_ != 10)) {
          bVar2 = ConsumeEndOfDeclaration(this,";",field_location);
        }
        else {
          LocationRecorder::LocationRecorder(&location,parent_location);
          LocationRecorder::StartAt(&location,field_location);
          SourceCodeInfo_Location::add_path
                    (location.location_,location_field_number_for_nested_type);
          SourceCodeInfo_Location::add_path
                    (location.location_,(messages->super_RepeatedPtrFieldBase).current_size_);
          this_00 = RepeatedPtrField<google::protobuf::DescriptorProto>::Add(messages);
          DescriptorProto::set_name(this_00,(field->name_).ptr_);
          LocationRecorder::LocationRecorder(&location_1,&location,1);
          LocationRecorder::StartAt(&location_1,&name_token);
          LocationRecorder::EndAt(&location_1,&name_token);
          LocationRecorder::RecordLegacyLocation(&location_1,&this_00->super_Message,NAME);
          LocationRecorder::~LocationRecorder(&location_1);
          LocationRecorder::LocationRecorder(&location_1,field_location,6);
          LocationRecorder::StartAt(&location_1,&name_token);
          LocationRecorder::EndAt(&location_1,&name_token);
          LocationRecorder::~LocationRecorder(&location_1);
          if ((byte)(*(((this_00->name_).ptr_)->_M_dataplus)._M_p + 0xa5U) < 0xe6) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&location_1,"Group names must start with a capital letter.",
                       (allocator<char> *)&type);
            AddError(this,name_token.line,name_token.column,(string *)&location_1);
            std::__cxx11::string::~string((string *)&location_1);
          }
          psVar4 = FieldDescriptorProto::mutable_name_abi_cxx11_(field);
          LowerString(psVar4);
          FieldDescriptorProto::set_type_name(field,(this_00->name_).ptr_);
          bVar2 = LookingAt(this,"{");
          if (!bVar2) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&location_1,"Missing group body.",(allocator<char> *)&type);
            AddError(this,(string *)&location_1);
            std::__cxx11::string::~string((string *)&location_1);
            this_01 = &location;
            goto LAB_002d7b14;
          }
          bVar2 = ParseMessageBlock(this,this_00,&location,containing_file);
          this = (Parser *)&location;
          LocationRecorder::~LocationRecorder((LocationRecorder *)this);
        }
        if (!bVar2) goto LAB_002d7b19;
        bVar2 = true;
        if (map_field.is_map_field == true) {
          GenerateMapEntry(this,&map_field,field,messages);
        }
      }
      else {
LAB_002d7b19:
        bVar2 = false;
      }
      std::__cxx11::string::~string((string *)&name_token.text);
      goto LAB_002d7b25;
    }
  }
LAB_002d7af7:
  std::__cxx11::string::~string((string *)&name_token);
  LocationRecorder::~LocationRecorder(&location);
  bVar2 = false;
LAB_002d7b25:
  MapField::~MapField(&map_field);
  return bVar2;
}

Assistant:

bool Parser::ParseMessageFieldNoLabel(
    FieldDescriptorProto* field,
    RepeatedPtrField<DescriptorProto>* messages,
    const LocationRecorder& parent_location,
    int location_field_number_for_nested_type,
    const LocationRecorder& field_location,
    const FileDescriptorProto* containing_file) {
  MapField map_field;
  // Parse type.
  {
    LocationRecorder location(field_location);  // add path later
    location.RecordLegacyLocation(field, DescriptorPool::ErrorCollector::TYPE);

    bool type_parsed = false;
    FieldDescriptorProto::Type type = FieldDescriptorProto::TYPE_INT32;
    string type_name;

    // Special case map field. We only treat the field as a map field if the
    // field type name starts with the word "map" with a following "<".
    if (TryConsume("map")) {
      if (LookingAt("<")) {
        map_field.is_map_field = true;
      } else {
        // False positive
        type_parsed = true;
        type_name = "map";
      }
    }
    if (map_field.is_map_field) {
      if (field->has_oneof_index()) {
        AddError("Map fields are not allowed in oneofs.");
        return false;
      }
      if (field->has_label()) {
        AddError(
            "Field labels (required/optional/repeated) are not allowed on "
            "map fields.");
        return false;
      }
      if (field->has_extendee()) {
        AddError("Map fields are not allowed to be extensions.");
        return false;
      }
      field->set_label(FieldDescriptorProto::LABEL_REPEATED);
      DO(Consume("<"));
      DO(ParseType(&map_field.key_type, &map_field.key_type_name));
      DO(Consume(","));
      DO(ParseType(&map_field.value_type, &map_field.value_type_name));
      DO(Consume(">"));
      // Defer setting of the type name of the map field until the
      // field name is parsed. Add the source location though.
      location.AddPath(FieldDescriptorProto::kTypeNameFieldNumber);
    } else {
      // Handle the case where no explicit label is given for a non-map field.
      if (!field->has_label() && DefaultToOptionalFields()) {
        field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
      }
      if (!field->has_label()) {
        AddError("Expected \"required\", \"optional\", or \"repeated\".");
        // We can actually reasonably recover here by just assuming the user
        // forgot the label altogether.
        field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
      }

      // Handle the case where the actual type is a message or enum named "map",
      // which we already consumed in the code above.
      if (!type_parsed) {
        DO(ParseType(&type, &type_name));
      }
      if (type_name.empty()) {
        location.AddPath(FieldDescriptorProto::kTypeFieldNumber);
        field->set_type(type);
      } else {
        location.AddPath(FieldDescriptorProto::kTypeNameFieldNumber);
        field->set_type_name(type_name);
      }
    }
  }

  // Parse name and '='.
  io::Tokenizer::Token name_token = input_->current();
  {
    LocationRecorder location(field_location,
                              FieldDescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(field, DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(field->mutable_name(), "Expected field name."));
  }
  DO(Consume("=", "Missing field number."));

  // Parse field number.
  {
    LocationRecorder location(field_location,
                              FieldDescriptorProto::kNumberFieldNumber);
    location.RecordLegacyLocation(
        field, DescriptorPool::ErrorCollector::NUMBER);
    int number;
    DO(ConsumeInteger(&number, "Expected field number."));
    field->set_number(number);
  }

  // Parse options.
  DO(ParseFieldOptions(field, field_location, containing_file));

  // Deal with groups.
  if (field->has_type() && field->type() == FieldDescriptorProto::TYPE_GROUP) {
    // Awkward:  Since a group declares both a message type and a field, we
    //   have to create overlapping locations.
    LocationRecorder group_location(parent_location);
    group_location.StartAt(field_location);
    group_location.AddPath(location_field_number_for_nested_type);
    group_location.AddPath(messages->size());

    DescriptorProto* group = messages->Add();
    group->set_name(field->name());

    // Record name location to match the field name's location.
    {
      LocationRecorder location(group_location,
                                DescriptorProto::kNameFieldNumber);
      location.StartAt(name_token);
      location.EndAt(name_token);
      location.RecordLegacyLocation(
          group, DescriptorPool::ErrorCollector::NAME);
    }

    // The field's type_name also comes from the name.  Confusing!
    {
      LocationRecorder location(field_location,
                                FieldDescriptorProto::kTypeNameFieldNumber);
      location.StartAt(name_token);
      location.EndAt(name_token);
    }

    // As a hack for backwards-compatibility, we force the group name to start
    // with a capital letter and lower-case the field name.  New code should
    // not use groups; it should use nested messages.
    if (group->name()[0] < 'A' || 'Z' < group->name()[0]) {
      AddError(name_token.line, name_token.column,
        "Group names must start with a capital letter.");
    }
    LowerString(field->mutable_name());

    field->set_type_name(group->name());
    if (LookingAt("{")) {
      DO(ParseMessageBlock(group, group_location, containing_file));
    } else {
      AddError("Missing group body.");
      return false;
    }
  } else {
    DO(ConsumeEndOfDeclaration(";", &field_location));
  }

  // Create a map entry type if this is a map field.
  if (map_field.is_map_field) {
    GenerateMapEntry(map_field, field, messages);
  }

  return true;
}